

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O2

scalar_function_t * __thiscall
duckdb::UDFWrapper::
CreateScalarFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
          (scalar_function_t *__return_storage_ptr__,UDFWrapper *this,string *name,
          vector<duckdb::LogicalType,_true> *args,LogicalType *ret_type,
          _func_string_t_string_t_string_t_string_t *udf_func)

{
  bool bVar1;
  runtime_error *this_00;
  
  bVar1 = TypesMatch<duckdb::string_t>((LogicalType *)args);
  if (bVar1) {
    if (name->_M_string_length - (long)(name->_M_dataplus)._M_p == 0x48) {
      CreateTernaryFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                (__return_storage_ptr__,this,name,args,ret_type,udf_func);
      return __return_storage_ptr__;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "The number of templated types should be the same quantity of the LogicalType arguments."
              );
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Return type doesn\'t match with the first template type.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline static scalar_function_t CreateScalarFunction(const string &name, const vector<LogicalType> &args,
	                                                     const LogicalType &ret_type, TR (*udf_func)(ARGS...)) {
		if (!TypesMatch<TR>(ret_type)) { // LCOV_EXCL_START
			throw std::runtime_error("Return type doesn't match with the first template type.");
		} // LCOV_EXCL_STOP

		const std::size_t num_template_types = sizeof...(ARGS);
		if (num_template_types != args.size()) { // LCOV_EXCL_START
			throw std::runtime_error(
			    "The number of templated types should be the same quantity of the LogicalType arguments.");
		} // LCOV_EXCL_STOP

		switch (num_template_types) {
		case 1:
			return CreateUnaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		case 2:
			return CreateBinaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		case 3:
			return CreateTernaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		default: // LCOV_EXCL_START
			throw std::runtime_error("UDF function only supported until ternary!");
		} // LCOV_EXCL_STOP
	}